

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifest_parser_test.cc
# Opt level: O2

void __thiscall ParserTestDefaultDefault::Run(ParserTestDefaultDefault *this)

{
  int iVar1;
  Test *pTVar2;
  bool condition;
  string err;
  _Vector_base<Node_*,_std::allocator<Node_*>_> local_58;
  string local_40;
  
  iVar1 = g_current_test->assertion_failures_;
  ParserTest::AssertParse
            (&this->super_ParserTest,
             "rule cat\n  command = cat $in > $out\nbuild a: cat foo\nbuild b: cat foo\nbuild c: cat foo\nbuild d: cat foo\n"
            );
  pTVar2 = g_current_test;
  if (iVar1 == g_current_test->assertion_failures_) {
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    local_40._M_string_length = 0;
    local_40.field_2._M_local_buf[0] = '\0';
    State::DefaultNodes((vector<Node_*,_std::allocator<Node_*>_> *)&local_58,
                        &(this->super_ParserTest).state,&local_40);
    testing::Test::Check
              (pTVar2,(long)local_58._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_58._M_impl.super__Vector_impl_data._M_start == 0x20,
               "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/manifest_parser_test.cc"
               ,0x409,"4u == state.DefaultNodes(&err).size()");
    std::_Vector_base<Node_*,_std::allocator<Node_*>_>::~_Vector_base(&local_58);
    pTVar2 = g_current_test;
    condition = std::operator==("",&local_40);
    testing::Test::Check
              (pTVar2,condition,
               "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/manifest_parser_test.cc"
               ,0x40a,"\"\" == err");
    std::__cxx11::string::~string((string *)&local_40);
  }
  else {
    g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
  }
  return;
}

Assistant:

TEST_F(ParserTest, DefaultDefault) {
  ASSERT_NO_FATAL_FAILURE(AssertParse(
"rule cat\n  command = cat $in > $out\n"
"build a: cat foo\n"
"build b: cat foo\n"
"build c: cat foo\n"
"build d: cat foo\n"));

  string err;
  EXPECT_EQ(4u, state.DefaultNodes(&err).size());
  EXPECT_EQ("", err);
}